

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O0

Point2f __thiscall
pbrt::SphericalMapping2D::Map
          (SphericalMapping2D *this,TextureEvalContext ctx,Vector2f *dstdx,Vector2f *dstdy)

{
  Tuple2<pbrt::Vector2,_float> TVar1;
  float fVar2;
  float *pfVar3;
  Tuple2<pbrt::Vector2,_float> *in_RDX;
  Tuple2<pbrt::Vector2,_float> *in_RSI;
  Tuple3<pbrt::Vector3,_float> *in_RDI;
  undefined1 auVar4 [64];
  undefined1 auVar15 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  Vector3<float> VVar16;
  Point3<float> PVar17;
  Point2f stDeltaY;
  Point2f stDeltaX;
  Float delta;
  Point2f st;
  Tuple2<pbrt::Vector2,_float> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  Point3<float> *this_00;
  undefined8 in_stack_ffffffffffffff20;
  Point3f *in_stack_ffffffffffffff80;
  SphericalMapping2D *in_stack_ffffffffffffff88;
  SphericalMapping2D *this_01;
  Tuple2<pbrt::Point2,_float> local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  
  fVar2 = (float)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  this_00 = (Point3<float> *)&stack0x00000008;
  auVar4._0_8_ = sphere(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  auVar4._8_56_ = extraout_var;
  local_8 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar4._0_16_);
  auVar15 = (undefined1  [56])0x0;
  VVar16 = pbrt::operator*(fVar2,in_RDI);
  auVar5._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar15;
  vmovlpd_avx(auVar5._0_16_);
  PVar17 = Point3<float>::operator+
                     (this_00,(Vector3<float> *)
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  auVar6._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6._8_56_ = auVar15;
  vmovlpd_avx(auVar6._0_16_);
  auVar7._0_8_ = sphere(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  auVar7._8_56_ = extraout_var_00;
  vmovlpd_avx(auVar7._0_16_);
  fVar2 = (float)((ulong)&local_8 >> 0x20);
  auVar8._0_8_ = Point2<float>::operator-
                           ((Point2<float> *)in_stack_fffffffffffffef8,(Point2<float> *)0x84b148);
  auVar8._8_56_ = extraout_var_01;
  this_01 = (SphericalMapping2D *)vmovlpd_avx(auVar8._0_16_);
  auVar9._0_8_ = Tuple2<pbrt::Vector2,float>::operator/(in_stack_fffffffffffffef8,0.0);
  auVar9._8_56_ = extraout_var_02;
  auVar15 = (undefined1  [56])0x0;
  TVar1 = (Tuple2<pbrt::Vector2,_float>)vmovlpd_avx(auVar9._0_16_);
  *in_RSI = TVar1;
  VVar16 = pbrt::operator*(fVar2,in_RDI);
  auVar10._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar15;
  vmovlpd_avx(auVar10._0_16_);
  PVar17 = Point3<float>::operator+
                     (this_00,(Vector3<float> *)
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  auVar11._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar15;
  vmovlpd_avx(auVar11._0_16_);
  auVar12._0_8_ = sphere(this_01,in_stack_ffffffffffffff80);
  auVar12._8_56_ = extraout_var_03;
  vmovlpd_avx(auVar12._0_16_);
  auVar13._0_8_ =
       Point2<float>::operator-
                 ((Point2<float> *)in_stack_fffffffffffffef8,(Point2<float> *)0x84b214);
  auVar13._8_56_ = extraout_var_04;
  vmovlpd_avx(auVar13._0_16_);
  auVar14._0_8_ = Tuple2<pbrt::Vector2,float>::operator/(in_stack_fffffffffffffef8,0.0);
  auVar14._8_56_ = extraout_var_05;
  TVar1 = (Tuple2<pbrt::Vector2,_float>)vmovlpd_avx(auVar14._0_16_);
  *in_RDX = TVar1;
  pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RSI,1);
  if (*pfVar3 <= 0.5) {
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RSI,1);
    if (*pfVar3 < -0.5) {
      pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RSI,1);
      fVar2 = -(*pfVar3 + 1.0);
      pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RSI,1);
      *pfVar3 = fVar2;
    }
  }
  else {
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RSI,1);
    fVar2 = 1.0 - *pfVar3;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RSI,1);
    *pfVar3 = fVar2;
  }
  pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RDX,1);
  if (*pfVar3 <= 0.5) {
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RDX,1);
    if (*pfVar3 < -0.5) {
      pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RDX,1);
      fVar2 = *pfVar3;
      pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RDX,1);
      *pfVar3 = -(fVar2 + 1.0);
    }
  }
  else {
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RDX,1);
    fVar2 = *pfVar3;
    pfVar3 = Tuple2<pbrt::Vector2,_float>::operator[](in_RDX,1);
    *pfVar3 = 1.0 - fVar2;
  }
  return (Point2f)local_8;
}

Assistant:

PBRT_CPU_GPU
    Point2f Map(TextureEvalContext ctx, Vector2f *dstdx, Vector2f *dstdy) const {
        Point2f st = sphere(ctx.p);
        // Compute texture coordinate differentials for sphere $(u,v)$ mapping
        const Float delta = .1f;
        Point2f stDeltaX = sphere(ctx.p + delta * ctx.dpdx);
        *dstdx = (stDeltaX - st) / delta;
        Point2f stDeltaY = sphere(ctx.p + delta * ctx.dpdy);
        *dstdy = (stDeltaY - st) / delta;

        // Handle sphere mapping discontinuity for coordinate differentials
        if ((*dstdx)[1] > .5)
            (*dstdx)[1] = 1 - (*dstdx)[1];
        else if ((*dstdx)[1] < -.5f)
            (*dstdx)[1] = -((*dstdx)[1] + 1);
        if ((*dstdy)[1] > .5)
            (*dstdy)[1] = 1 - (*dstdy)[1];
        else if ((*dstdy)[1] < -.5f)
            (*dstdy)[1] = -((*dstdy)[1] + 1);

        return st;
    }